

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

void __thiscall capnp::_::PointerBuilder::transferFrom(PointerBuilder *this,PointerBuilder other)

{
  WirePointer *pWVar1;
  
  pWVar1 = this->pointer;
  if ((pWVar1->field_1).upper32Bits != 0 || (pWVar1->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(this->segment,this->capTable,pWVar1);
    pWVar1 = this->pointer;
    pWVar1->offsetAndKind = 0;
    pWVar1->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  WireHelpers::transferPointer(this->segment,this->pointer,other.segment,other.pointer);
  (other.pointer)->offsetAndKind = 0;
  (other.pointer)->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  return;
}

Assistant:

void PointerBuilder::transferFrom(PointerBuilder other) {
  if (!pointer->isNull()) {
    WireHelpers::zeroObject(segment, capTable, pointer);
    WireHelpers::zeroMemory(pointer);
  }
  WireHelpers::transferPointer(segment, pointer, other.segment, other.pointer);
  WireHelpers::zeroMemory(other.pointer);
}